

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O0

void Abc_NtkCleanNext_rec(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  Abc_Ntk_t *pNtk_00;
  int local_1c;
  int i;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtk_local;
  
  Abc_NtkCleanNext(pNtk);
  for (local_1c = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), local_1c < iVar1; local_1c = local_1c + 1) {
    pObj_00 = Abc_NtkBox(pNtk,local_1c);
    pNtk_00 = Abc_ObjModel(pObj_00);
    Abc_NtkCleanNext_rec(pNtk_00);
  }
  return;
}

Assistant:

void Abc_NtkCleanNext_rec( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj; 
    int i;
    Abc_NtkCleanNext( pNtk );
    Abc_NtkForEachBox( pNtk, pObj, i )
        Abc_NtkCleanNext_rec( Abc_ObjModel(pObj) );
}